

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.h
# Opt level: O0

void shuffle<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array)

{
  int iVar1;
  time_t tVar2;
  size_type sVar3;
  reference pvVar4;
  reference this;
  string local_38 [8];
  value_type temp;
  int randomIndex;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_local;
  
  if (!shuffle<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       isInitialized) {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    shuffle<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    isInitialized = true;
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(array);
  temp.field_2._12_4_ = (undefined4)sVar3;
  while (temp.field_2._12_4_ = temp.field_2._12_4_ + -1, 0 < (int)temp.field_2._12_4_) {
    iVar1 = rand();
    temp.field_2._8_4_ = iVar1 % (temp.field_2._12_4_ + 1);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](array,(long)(int)temp.field_2._12_4_);
    std::__cxx11::string::string(local_38,(string *)pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](array,(long)(int)temp.field_2._8_4_);
    this = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](array,(long)(int)temp.field_2._12_4_);
    std::__cxx11::string::operator=((string *)this,(string *)pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](array,(long)(int)temp.field_2._8_4_);
    std::__cxx11::string::operator=((string *)pvVar4,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void shuffle(std::vector<T>& array) {
    static bool isInitialized = false;
    if (!isInitialized) {
        srand(time(nullptr));
        isInitialized =  true;
    }
    for(int i = array.size()-1; i > 0; i--) {
        auto randomIndex = rand() % (i + 1);
        auto temp = array[i];
        array[i] = array[randomIndex];
        array[randomIndex] = temp;
    }
}